

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__gif_test(stbi__context *s)

{
  stbi_uc sVar1;
  stbi_uc *psVar2;
  uint uVar3;
  uint uVar4;
  
  psVar2 = s->img_buffer;
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) {
      uVar3 = 0;
      goto LAB_0011025e;
    }
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  s->img_buffer = psVar2 + 1;
  uVar3 = 0;
  uVar4 = 0;
  if (*psVar2 != 'G') goto LAB_0011025e;
  psVar2 = s->img_buffer;
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) goto LAB_0011025e;
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  s->img_buffer = psVar2 + 1;
  if (*psVar2 != 'I') goto LAB_0011025e;
  psVar2 = s->img_buffer;
  uVar3 = uVar4;
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) goto LAB_0011025e;
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  s->img_buffer = psVar2 + 1;
  if (*psVar2 != 'F') goto LAB_0011025e;
  psVar2 = s->img_buffer;
  if (s->img_buffer_end <= psVar2) {
    if (s->read_from_callbacks == 0) goto LAB_0011025e;
    stbi__refill_buffer(s);
    psVar2 = s->img_buffer;
  }
  s->img_buffer = psVar2 + 1;
  if (*psVar2 != '8') goto LAB_0011025e;
  psVar2 = s->img_buffer;
  if (psVar2 < s->img_buffer_end) {
LAB_00110208:
    s->img_buffer = psVar2 + 1;
    sVar1 = *psVar2;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar2 = s->img_buffer;
      goto LAB_00110208;
    }
    sVar1 = '\0';
  }
  if ((sVar1 == '9') || (sVar1 == '7')) {
    psVar2 = s->img_buffer;
    if (s->img_buffer_end <= psVar2) {
      if (s->read_from_callbacks == 0) goto LAB_0011025e;
      stbi__refill_buffer(s);
      psVar2 = s->img_buffer;
    }
    s->img_buffer = psVar2 + 1;
    uVar3 = (uint)(*psVar2 == 'a');
  }
LAB_0011025e:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar3;
}

Assistant:

static int stbi__gif_test(stbi__context *s)
{
   int r = stbi__gif_test_raw(s);
   stbi__rewind(s);
   return r;
}